

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_load(CompilerHLSL *this,Instruction *instruction)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRExpression *e_00;
  bool local_fa;
  bool local_e1;
  SPIRExpression *e;
  _Node_iterator_base<unsigned_int,_false> local_c8;
  bool local_ba;
  allocator local_b9;
  string local_b8 [6];
  bool forward;
  string local_98 [8];
  string load_expr;
  undefined1 local_68 [40];
  SPIRType *pSStack_40;
  bool composite_load;
  SPIRType *type;
  uint32_t local_30;
  uint32_t ptr;
  uint32_t id;
  uint32_t result_type;
  SPIRAccessChain *chain;
  uint32_t *ops;
  Instruction *instruction_local;
  CompilerHLSL *this_local;
  
  ops = (uint32_t *)instruction;
  instruction_local = (Instruction *)this;
  chain = (SPIRAccessChain *)Compiler::stream((Compiler *)this,instruction);
  _id = Compiler::maybe_get<spirv_cross::SPIRAccessChain>
                  ((Compiler *)this,(chain->super_IVariant).self.id);
  if (_id == (SPIRAccessChain *)0x0) {
    CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,(Instruction *)ops);
  }
  else {
    ptr = *(uint32_t *)&(chain->super_IVariant)._vptr_IVariant;
    local_30 = *(uint32_t *)((long)&(chain->super_IVariant)._vptr_IVariant + 4);
    type._4_4_ = (chain->super_IVariant).self.id;
    TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)&type,type._4_4_);
    bVar1 = Compiler::has_decoration((Compiler *)this,type._0_4_,DecorationNonUniform);
    if (bVar1) {
      CompilerGLSL::propagate_nonuniform_qualifier(&this->super_CompilerGLSL,type._4_4_);
    }
    pSStack_40 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,ptr);
    bVar1 = VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
    local_e1 = true;
    if (bVar1) {
      local_e1 = *(int *)&(pSStack_40->super_IVariant).field_0xc == 0xf;
    }
    local_68[0x27] = local_e1;
    if (local_e1 == false) {
      ::std::__cxx11::string::string(local_98);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b8,"",&local_b9);
      read_access_chain(this,(string *)local_98,(string *)local_b8,_id);
      ::std::__cxx11::string::~string(local_b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,type._4_4_);
      local_fa = false;
      if (bVar1) {
        local_c8._M_cur =
             (__node_type *)
             ::std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::find(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries,&local_30);
        e = (SPIRExpression *)
            ::std::
            end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                      (&(this->super_CompilerGLSL).super_Compiler.forced_temporaries);
        local_fa = ::std::__detail::operator==
                             (&local_c8,(_Node_iterator_base<unsigned_int,_false> *)&e);
      }
      local_ba = local_fa;
      if (local_fa == false) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(_id->super_IVariant).self);
        CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,uVar2);
      }
      if (1 < pSStack_40->columns) {
        local_ba = false;
      }
      e_00 = CompilerGLSL::emit_op
                       (&this->super_CompilerGLSL,ptr,local_30,(string *)local_98,
                        (bool)(local_ba & 1),true);
      e_00->need_transpose = false;
      Compiler::register_read((Compiler *)this,local_30,type._4_4_,(bool)(local_ba & 1));
      Compiler::inherit_expression_dependencies((Compiler *)this,local_30,type._4_4_);
      if ((local_ba & 1U) != 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(_id->super_IVariant).self);
        Compiler::add_implied_read_expression((Compiler *)this,e_00,uVar2);
      }
      ::std::__cxx11::string::~string(local_98);
    }
    else {
      CompilerGLSL::emit_uninitialized_temporary_expression(&this->super_CompilerGLSL,ptr,local_30);
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_68,(uint32_t)this,SUB41(local_30,0));
      read_access_chain(this,(string *)0x0,(string *)local_68,_id);
      ::std::__cxx11::string::~string((string *)local_68);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(_id->super_IVariant).self);
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,uVar2);
    }
  }
  return;
}

Assistant:

void CompilerHLSL::emit_load(const Instruction &instruction)
{
	auto ops = stream(instruction);

	auto *chain = maybe_get<SPIRAccessChain>(ops[2]);
	if (chain)
	{
		uint32_t result_type = ops[0];
		uint32_t id = ops[1];
		uint32_t ptr = ops[2];

		if (has_decoration(ptr, DecorationNonUniformEXT))
			propagate_nonuniform_qualifier(ptr);

		auto &type = get<SPIRType>(result_type);
		bool composite_load = !type.array.empty() || type.basetype == SPIRType::Struct;

		if (composite_load)
		{
			// We cannot make this work in one single expression as we might have nested structures and arrays,
			// so unroll the load to an uninitialized temporary.
			emit_uninitialized_temporary_expression(result_type, id);
			read_access_chain(nullptr, to_expression(id), *chain);
			track_expression_read(chain->self);
		}
		else
		{
			string load_expr;
			read_access_chain(&load_expr, "", *chain);

			bool forward = should_forward(ptr) && forced_temporaries.find(id) == end(forced_temporaries);

			// If we are forwarding this load,
			// don't register the read to access chain here, defer that to when we actually use the expression,
			// using the add_implied_read_expression mechanism.
			if (!forward)
				track_expression_read(chain->self);

			// Do not forward complex load sequences like matrices, structs and arrays.
			if (type.columns > 1)
				forward = false;

			auto &e = emit_op(result_type, id, load_expr, forward, true);
			e.need_transpose = false;
			register_read(id, ptr, forward);
			inherit_expression_dependencies(id, ptr);
			if (forward)
				add_implied_read_expression(e, chain->self);
		}
	}
	else
		CompilerGLSL::emit_instruction(instruction);
}